

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Comp::set(V2Comp *this,syVComp *para)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float local_20;
  float thresh;
  int oldmode;
  syVComp *para_local;
  V2Comp *this_local;
  
  iVar1 = this->mode;
  iVar2 = (int)para->mode;
  if (iVar2 == 0) {
    this->mode = 4;
  }
  else if (iVar2 == 1) {
    this->mode = 0;
  }
  else {
    if (iVar2 != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                    ,0x861,"void V2Comp::set(const syVComp *)");
    }
    this->mode = 1;
  }
  if ((para->stereo != 0.0) || (NAN(para->stereo))) {
    this->mode = this->mode | 2;
  }
  if (this->mode != iVar1) {
    reset(this);
  }
  this->dblen = (int)(para->lookahead * this->inst->SRfcsamplesperms);
  local_20 = calcfreq(para->threshold / 128.0);
  local_20 = local_20 * 8.0;
  this->invol = 1.0 / local_20;
  if ((para->autogain != 0.0) || (NAN(para->autogain))) {
    local_20 = 1.0;
  }
  fVar3 = powf(2.0,(para->outgain - 64.0) / 16.0);
  this->outvol = local_20 * fVar3;
  this->ratio = para->ratio / 128.0;
  fVar3 = powf(2.0,(-para->attack * 12.0) / 128.0);
  this->attack = fVar3;
  fVar3 = powf(2.0,(-para->release * 16.0) / 128.0);
  this->release = fVar3;
  return;
}

Assistant:

void set(const syVComp *para)
    {
        int oldmode = mode;
        switch ((int)para->mode)
        {
        case MODE_OFF:  mode = MODE_BIT_OFF; break;
        case MODE_PEAK: mode = MODE_BIT_PEAK | MODE_BIT_ON; break;
        case MODE_RMS:  mode = MODE_BIT_RMS | MODE_BIT_ON; break;
        default:        assert(false);
        }

        if (para->stereo != 0.0f)
            mode |= MODE_BIT_STEREO;

        if (mode != oldmode)
            reset();

        // @@@BUG: original V2 code uses "fcsamplesperms" here which is
        // hard-coded to 44.1kHz
        dblen = (int)(para->lookahead * inst->SRfcsamplesperms);

        float thresh = 8.0f * calcfreq(para->threshold / 128.0f);
        invol = 1.0f / thresh;
        if (para->autogain != 0.0f)
            thresh = 1.0f;
        outvol = thresh * powf(2.0f, (para->outgain - 64.0f) / 16.0f);
        ratio = para->ratio / 128.0f;

        // attack: 0 (!) ... 200ms (5Hz)
        attack = powf(2.0f, -para->attack * 12.0f / 128.0f);
        // release: 5ms .. 5s
        release = powf(2.0f, -para->release * 16.0f / 128.0f);
    }